

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RS232Port.h
# Opt level: O1

int PurgeRS232Port(RS232PORT *pRS232Port)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  uint uVar5;
  ulong uVar6;
  fd_set sock_set;
  timeval local_4c8;
  fd_set local_4b8;
  undefined1 local_438 [1032];
  
  uVar5 = 1;
  if (pRS232Port->DevType - 1U < 4) {
    iVar3 = pRS232Port->s;
    local_4c8.tv_sec = 0;
    local_4c8.tv_usec = 0;
    local_4b8.fds_bits[0] = 0;
    local_4b8.fds_bits[1] = 0;
    local_4b8.fds_bits[2] = 0;
    local_4b8.fds_bits[3] = 0;
    local_4b8.fds_bits[4] = 0;
    local_4b8.fds_bits[5] = 0;
    local_4b8.fds_bits[6] = 0;
    local_4b8.fds_bits[7] = 0;
    local_4b8.fds_bits[8] = 0;
    local_4b8.fds_bits[9] = 0;
    local_4b8.fds_bits[10] = 0;
    local_4b8.fds_bits[0xb] = 0;
    iVar1 = iVar3 + 0x3f;
    if (-1 < iVar3) {
      iVar1 = iVar3;
    }
    uVar6 = 1L << ((byte)(iVar3 % 0x40) & 0x3f);
    local_4b8.fds_bits[0xc] = 0;
    local_4b8.fds_bits[0xd] = 0;
    local_4b8.fds_bits[0xe] = 0;
    local_4b8.fds_bits[0xf] = 0;
    iVar1 = iVar1 >> 6;
    local_4b8.fds_bits[iVar1] = local_4b8.fds_bits[iVar1] | uVar6;
    iVar2 = select(iVar3 + 1,&local_4b8,(fd_set *)0x0,(fd_set *)0x0,&local_4c8);
    if (0 < iVar2) {
      do {
        sVar4 = recv(iVar3,local_438,0x400,0);
        if (sVar4 < 1) {
          local_4b8.fds_bits[iVar1] = local_4b8.fds_bits[iVar1] & ~uVar6;
          return 1;
        }
        local_4c8.tv_sec = 0;
        local_4c8.tv_usec = 0;
        iVar2 = select(iVar3 + 1,&local_4b8,(fd_set *)0x0,(fd_set *)0x0,&local_4c8);
      } while (0 < iVar2);
    }
    local_4b8.fds_bits[iVar1] = local_4b8.fds_bits[iVar1] & ~uVar6;
    uVar5 = (uint)(iVar2 == -1);
  }
  else if (pRS232Port->DevType == 0) {
    iVar3 = tcflush(*(int *)&pRS232Port->hDev,2);
    uVar5 = (uint)(iVar3 != 0);
  }
  return uVar5;
}

Assistant:

inline int PurgeRS232Port(RS232PORT* pRS232Port)
{
	switch (pRS232Port->DevType)
	{
	case TCP_CLIENT_TYPE_RS232PORT:
	case TCP_SERVER_TYPE_RS232PORT:
	case UDP_CLIENT_TYPE_RS232PORT:
	case UDP_SERVER_TYPE_RS232PORT:
		return flushsocket(pRS232Port->s);
	case LOCAL_TYPE_RS232PORT:
		return PurgeComputerRS232Port(pRS232Port->hDev);
	default:
		PRINT_DEBUG_ERROR_RS232PORT(("PurgeRS232Port error (%s) : %s(pRS232Port=%#x)\n", 
			strtime_m(), 
			"Invalid device type. ", 
			pRS232Port));
		return EXIT_FAILURE;
	}
}